

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int JS_SetGlobalVar(JSContext *ctx,JSAtom prop,JSValue val,int flag)

{
  long lVar1;
  int *piVar2;
  void *pvVar3;
  long lVar4;
  JSValueUnion JVar5;
  JSStackFrame *pJVar6;
  JSValue v;
  int iVar7;
  uint uVar8;
  JSValueUnion *pJVar9;
  uint *puVar10;
  
  pvVar3 = (ctx->global_var_obj).u.ptr;
  lVar4 = *(long *)((long)pvVar3 + 0x18);
  uVar8 = *(uint *)(lVar4 + ~(ulong)(*(uint *)(lVar4 + 0x20) & prop) * 4);
  if (uVar8 == 0) {
    pJVar9 = (JSValueUnion *)0x0;
    puVar10 = (uint *)0x0;
  }
  else {
    pJVar9 = (JSValueUnion *)0x0;
    do {
      lVar1 = lVar4 + 0x40 + (ulong)uVar8 * 8;
      puVar10 = (uint *)(lVar1 + -8);
      if (*(JSAtom *)(lVar1 + -4) == prop) {
        pJVar9 = (JSValueUnion *)(((ulong)uVar8 - 1) * 0x10 + *(long *)((long)pvVar3 + 0x20));
        break;
      }
      uVar8 = *puVar10;
      puVar10 = (uint *)0x0;
      uVar8 = uVar8 & 0x3ffffff;
    } while (uVar8 != 0);
  }
  if (puVar10 == (uint *)0x0) {
    pJVar6 = ctx->rt->current_stack_frame;
    if (pJVar6 == (JSStackFrame *)0x0) {
      uVar8 = 0x8000;
    }
    else {
      uVar8 = ((byte)pJVar6->js_mode & 1) << 0x10 | 0x8000;
    }
    iVar7 = JS_SetPropertyInternal(ctx,ctx->global_obj,prop,val,uVar8);
    return iVar7;
  }
  if (flag == 1) {
LAB_00139ae4:
    piVar2 = (int *)pJVar9->ptr;
    JVar5 = pJVar9[1];
    v = *(JSValue *)pJVar9;
    *pJVar9 = val.u;
    pJVar9[1] = (JSValueUnion)val.tag;
    if ((0xfffffff4 < (uint)JVar5.int32) && (iVar7 = *piVar2, *piVar2 = iVar7 + -1, iVar7 < 2)) {
      __JS_FreeValueRT(ctx->rt,v);
    }
    iVar7 = 0;
  }
  else {
    if (pJVar9[1].int32 == 4) {
      JS_FreeValue(ctx,val);
      JS_ThrowReferenceErrorUninitialized(ctx,puVar10[1]);
    }
    else {
      if ((*puVar10 & 0x8000000) != 0) goto LAB_00139ae4;
      JS_FreeValue(ctx,val);
      __JS_ThrowTypeErrorAtom(ctx,prop,"\'%s\' is read-only");
    }
    iVar7 = -1;
  }
  return iVar7;
}

Assistant:

static int JS_SetGlobalVar(JSContext *ctx, JSAtom prop, JSValue val,
                           int flag)
{
    JSObject *p;
    JSShapeProperty *prs;
    JSProperty *pr;
    int flags;

    /* no exotic behavior is possible in global_var_obj */
    p = JS_VALUE_GET_OBJ(ctx->global_var_obj);
    prs = find_own_property(&pr, p, prop);
    if (prs) {
        /* XXX: should handle JS_PROP_AUTOINIT properties? */
        if (flag != 1) {
            if (unlikely(JS_IsUninitialized(pr->u.value))) {
                JS_FreeValue(ctx, val);
                JS_ThrowReferenceErrorUninitialized(ctx, prs->atom);
                return -1;
            }
            if (unlikely(!(prs->flags & JS_PROP_WRITABLE))) {
                JS_FreeValue(ctx, val);
                return JS_ThrowTypeErrorReadOnly(ctx, JS_PROP_THROW, prop);
            }
        }
        set_value(ctx, &pr->u.value, val);
        return 0;
    }
    flags = JS_PROP_THROW_STRICT;
    if (is_strict_mode(ctx)) 
        flags |= JS_PROP_NO_ADD;
    return JS_SetPropertyInternal(ctx, ctx->global_obj, prop, val, flags);
}